

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O2

void http_server_stop(nni_http_server *s)

{
  http_sconn *sc;
  
  http_server_close(s);
  for (sc = (http_sconn *)nni_list_first(&s->conns); sc != (http_sconn *)0x0;
      sc = (http_sconn *)nni_list_next(&s->conns,sc)) {
    http_sconn_close(sc);
  }
  return;
}

Assistant:

static void
http_server_stop(nni_http_server *s)
{
	http_sconn *sc;

	http_server_close(s);

	// Stopping the server is a hard stop -- it aborts any work
	// being done by clients.  (No graceful shutdown).
	NNI_LIST_FOREACH (&s->conns, sc) {
		http_sconn_close(sc);
	}
}